

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_scheduler.c
# Opt level: O1

int mk_sched_threads_destroy_conn(mk_sched_worker *sched,mk_sched_conn *conn)

{
  mk_list *pmVar1;
  int iVar2;
  mk_list *pmVar3;
  
  pmVar3 = (sched->threads).next;
  if (pmVar3 == &sched->threads) {
    iVar2 = 0;
  }
  else {
    iVar2 = 0;
    do {
      pmVar1 = pmVar3->next;
      if ((mk_sched_conn *)pmVar3[-2].next[2].prev == conn) {
        mk_http_thread_destroy((mk_http_thread *)(pmVar3 + -2));
        iVar2 = iVar2 + 1;
      }
      pmVar3 = pmVar1;
    } while (pmVar1 != &sched->threads);
  }
  return iVar2;
}

Assistant:

int mk_sched_threads_destroy_conn(struct mk_sched_worker *sched,
                                  struct mk_sched_conn *conn)
{
    int c = 0;
    struct mk_list *tmp;
    struct mk_list *head;
    struct mk_http_thread *mth;
    (void) sched;

    mk_list_foreach_safe(head, tmp, &sched->threads) {
        mth = mk_list_entry(head, struct mk_http_thread, _head);
        if (mth->session->conn == conn) {
            mk_http_thread_destroy(mth);
            c++;
        }
    }
    return c;
}